

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O2

EXTRA_DESCR_DATA * new_extra_descr(void)

{
  EXTRA_DESCR_DATA *pEVar1;
  
  if (extra_descr_free == (EXTRA_DESCR_DATA *)0x0) {
    pEVar1 = (EXTRA_DESCR_DATA *)operator_new(0x20);
  }
  else {
    pEVar1 = extra_descr_free;
    extra_descr_free = extra_descr_free->next;
  }
  pEVar1->keyword = str_empty;
  pEVar1->description = str_empty;
  pEVar1->valid = true;
  return pEVar1;
}

Assistant:

EXTRA_DESCR_DATA *new_extra_descr(void)
{
	EXTRA_DESCR_DATA *ed;

	if (extra_descr_free == nullptr)
	{
		ed = new EXTRA_DESCR_DATA;
	}
	else
	{
		ed = extra_descr_free;
		extra_descr_free = extra_descr_free->next;
	}

	ed->keyword = &str_empty[0];
	ed->description = &str_empty[0];

	ed->valid = true;
	return ed;
}